

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_write.c
# Opt level: O3

int write_s98v3(s98c *ctx,FILE *fp)

{
  s98deviceinfo *psVar1;
  int iVar2;
  ulong uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  long lVar7;
  uint32_t local_3c;
  long local_38;
  
  iVar2 = (ctx->header).device_count * 0x10;
  local_38 = (long)ctx->p - (long)ctx->dump_buffer;
  uVar4 = iVar2 + 0x20 + (int)local_38;
  if (ctx->tags_count == 0) {
    uVar4 = 0;
  }
  iVar6 = (int)ctx->dump_buffer;
  uVar5 = iVar2 + 0x20 + ((int)ctx->loop_start - iVar6);
  if (ctx->loop_start == (uint8_t *)0x0) {
    uVar5 = 0;
  }
  iVar6 = (int)ctx->dump_start - iVar6;
  if (ctx->dump_start == (uint8_t *)0x0) {
    iVar6 = 0;
  }
  (ctx->header).offset_to_tag = uVar4;
  (ctx->header).offset_to_dump = iVar2 + iVar6 + 0x20;
  (ctx->header).offset_to_loop = uVar5;
  fwrite("S98",1,3,(FILE *)fp);
  fputc((ctx->header).version + 0x30,(FILE *)fp);
  local_3c = (ctx->header).timer_numerator;
  fwrite(&local_3c,1,4,(FILE *)fp);
  local_3c = (ctx->header).timer_denominator;
  fwrite(&local_3c,1,4,(FILE *)fp);
  local_3c = 0;
  fwrite(&local_3c,1,4,(FILE *)fp);
  local_3c = (ctx->header).offset_to_tag;
  fwrite(&local_3c,1,4,(FILE *)fp);
  local_3c = (ctx->header).offset_to_dump;
  fwrite(&local_3c,1,4,(FILE *)fp);
  local_3c = (ctx->header).offset_to_loop;
  fwrite(&local_3c,1,4,(FILE *)fp);
  local_3c = (ctx->header).device_count;
  fwrite(&local_3c,1,4,(FILE *)fp);
  if ((ctx->header).device_count != 0) {
    lVar7 = 0xc;
    uVar3 = 0;
    do {
      psVar1 = ctx->devices;
      local_3c = *(uint32_t *)((long)psVar1 + lVar7 + -0xc);
      fwrite(&local_3c,1,4,(FILE *)fp);
      local_3c = *(uint32_t *)((long)psVar1 + lVar7 + -8);
      fwrite(&local_3c,1,4,(FILE *)fp);
      local_3c = *(uint32_t *)((long)psVar1 + lVar7 + -4);
      fwrite(&local_3c,1,4,(FILE *)fp);
      local_3c = *(uint32_t *)((long)&psVar1->device + lVar7);
      fwrite(&local_3c,1,4,(FILE *)fp);
      uVar3 = uVar3 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar3 < (ctx->header).device_count);
  }
  fwrite(ctx->dump_buffer,1,(long)(int)local_38,(FILE *)fp);
  write_s98v3_tags(ctx,fp);
  return 0;
}

Assistant:

int write_s98v3(struct s98c* ctx, FILE* fp)
{
    int header_size = 0x20; 
    int devices_size = sizeof(struct s98deviceinfo) * ctx->header.device_count;
    int dump_offset = header_size + devices_size;
    int loop_offset = 0;
    int dump_length = ctx->p - ctx->dump_buffer;
    int tag_offset = (ctx->tags_count == 0) ? 0 : dump_offset + dump_length;

    if(ctx->loop_start != NULL) {
        loop_offset = dump_offset + (ctx->loop_start - ctx->dump_buffer);
    }
    if(ctx->dump_start != NULL) {
        dump_offset += (ctx->dump_start - ctx->dump_buffer);
    }
    ctx->header.offset_to_tag = tag_offset;
    ctx->header.offset_to_dump = dump_offset;
    ctx->header.offset_to_loop = loop_offset;

    fwrite("S98", 1, 3, fp); // 0
    fputc('0' + ctx->header.version, fp); // 3
    write_dword(fp, ctx->header.timer_numerator); // 4
    write_dword(fp, ctx->header.timer_denominator); // 8
    write_dword(fp, 0); // c
    write_dword(fp, ctx->header.offset_to_tag); // 10 
    write_dword(fp, ctx->header.offset_to_dump); //14
    write_dword(fp, ctx->header.offset_to_loop); //18
    write_dword(fp, ctx->header.device_count);

    int i;
    for(i = 0; i < ctx->header.device_count; i++) {
        struct s98deviceinfo* info = ctx->devices + i;

        write_dword(fp, info->device);
        write_dword(fp, info->clock);
        write_dword(fp, info->panpot);
        write_dword(fp, info->reserved);
    }
    
    fwrite(ctx->dump_buffer, 1, dump_length, fp);
    write_s98v3_tags(ctx, fp);

    return 0;
}